

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool CombinationKeyTest<unsigned_long,block128>
               (hashfunc<unsigned_long> hash,int maxlen,block128 *blocks,int blockcount,
               bool testColl,bool testDist,bool drawDiagram)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type sVar4;
  uint in_ECX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  bool in_stack_0000002b;
  bool in_stack_0000002c;
  bool in_stack_0000002d;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000030;
  bool result;
  block128 *key;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  pfHash in_stack_ffffffffffffff70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  uint local_c;
  hashfunc local_8 [8];
  
  local_1d = in_R8B & 1;
  local_1e = in_R9B & 1;
  local_1f = in_stack_00000008 & 1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  printf("Keyset \'Combination\' - up to %d blocks from a set of %d - ",(ulong)in_ESI,(ulong)in_ECX)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14dc0a);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_c;
  uVar3 = SUB168(auVar1 * ZEXT816(0x80),0);
  if (SUB168(auVar1 * ZEXT816(0x80),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new__(uVar3);
  pvVar5 = this;
  hashfunc::operator_cast_to_function_pointer(local_8);
  CombinationKeygenRecurse<unsigned_long,block128>
            ((block128 *)CONCAT44(local_1c,in_stack_ffffffffffffff90),(int)((ulong)local_18 >> 0x20)
             ,(int)local_18,(block128 *)CONCAT44(local_c,in_stack_ffffffffffffff80),
             (int)((ulong)pvVar5 >> 0x20),in_stack_ffffffffffffff70,in_RDX);
  if (this != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    operator_delete__(this);
  }
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_38);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar2 = TestHashList<unsigned_long>
                    (in_stack_00000030,in_stack_0000002f,in_stack_0000002e,in_stack_0000002d,
                     in_stack_0000002c,in_stack_0000002b);
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return bVar2;
}

Assistant:

bool CombinationKeyTest ( hashfunc<hashtype> hash, int maxlen, blocktype* blocks,
                          int blockcount, bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Combination' - up to %d blocks from a set of %d - ",maxlen,blockcount);

  //----------

  std::vector<hashtype> hashes;

  blocktype * key = new blocktype[maxlen];

  CombinationKeygenRecurse(key,0,maxlen,blocks,blockcount,hash,hashes);

  delete [] key;

  printf("%d keys\n",(int)hashes.size());

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}